

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O0

void deMemPool_destroy(deMemPool *pool)

{
  deMemPool *pdVar1;
  MemPage *pMVar2;
  MemPage *nextPage;
  MemPage *page;
  deMemPool *parent;
  deMemPool *iterNext;
  deMemPool *iter;
  deMemPool *pool_local;
  
  iterNext = pool->firstChild;
  while (iterNext != (deMemPool *)0x0) {
    pdVar1 = iterNext->nextPool;
    deMemPool_destroy(iterNext);
    iterNext = pdVar1;
  }
  if (pool->prevPool != (deMemPool *)0x0) {
    pool->prevPool->nextPool = pool->nextPool;
  }
  if (pool->nextPool != (deMemPool *)0x0) {
    pool->nextPool->prevPool = pool->prevPool;
  }
  if (pool->parent != (deMemPool *)0x0) {
    pdVar1 = pool->parent;
    if (pdVar1->firstChild == pool) {
      pdVar1->firstChild = pool->nextPool;
    }
    pdVar1->numChildren = pdVar1->numChildren + -1;
  }
  nextPage = pool->currentPage;
  while (nextPage != (MemPage *)0x0) {
    pMVar2 = nextPage->nextPage;
    MemPage_destroy(nextPage);
    nextPage = pMVar2;
  }
  return;
}

Assistant:

void deMemPool_destroy (deMemPool* pool)
{
	deMemPool* iter;
	deMemPool* iterNext;

#if defined(DE_SUPPORT_POOL_MEMORY_TRACKING)
	/* Update memory consumption statistics. */
	if (pool->parent)
	{
		deMemPool* root = pool->parent;
		while (root->parent)
			root = root->parent;
		root->maxMemoryAllocated	= deMax32(root->maxMemoryAllocated, deMemPool_getNumAllocatedBytes(root, DE_TRUE));
		root->maxMemoryCapacity		= deMax32(root->maxMemoryCapacity, deMemPool_getCapacity(root, DE_TRUE));
	}
#endif

	/* Destroy all children. */
	iter = pool->firstChild;
	while (iter)
	{
		iterNext = iter->nextPool;
		deMemPool_destroy(iter);
		iter = iterNext;
	}

	DE_ASSERT(pool->numChildren == 0);

	/* Update pointers. */
	if (pool->prevPool) pool->prevPool->nextPool = pool->nextPool;
	if (pool->nextPool) pool->nextPool->prevPool = pool->prevPool;

	if (pool->parent)
	{
		deMemPool* parent = pool->parent;
		if (parent->firstChild == pool)
			parent->firstChild = pool->nextPool;

		parent->numChildren--;
		DE_ASSERT(parent->numChildren >= 0);
	}

#if defined(DE_SUPPORT_DEBUG_POOLS)
	/* Free all debug allocations. */
	if (pool->enableDebugAllocs)
	{
		DebugAlloc* alloc	= pool->debugAllocListHead;
		DebugAlloc* next;

		while (alloc)
		{
			next = alloc->next;
			deAlignedFree(alloc->memPtr);
			deFree(alloc);
			alloc = next;
		}

		pool->debugAllocListHead = DE_NULL;
	}
#endif

	/* Free pages. */
	/* \note Pool itself is allocated from first page, so we must not touch the pool after freeing the page! */
	{
		MemPage* page = pool->currentPage;
		MemPage* nextPage;

		while (page)
		{
			nextPage = page->nextPage;
			MemPage_destroy(page);
			page = nextPage;
		}
	}
}